

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_refcount.c
# Opt level: O1

uo_refcount * uo_refcount_create(void *ptr,_func_void_void_ptr *finalizer)

{
  long *plVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  uo_refcount_linkpool_grow(0x20);
  plVar1 = *(long **)(in_FS_OFFSET + -8);
  lVar2 = *plVar1;
  *(long *)(lVar2 + 8) = plVar1[1];
  *(long *)plVar1[1] = lVar2;
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[4] = 1;
  plVar1[2] = (long)ptr;
  plVar1[3] = (long)finalizer;
  return (uo_refcount *)(plVar1 + 2);
}

Assistant:

uo_refcount *uo_refcount_create(
    void *ptr,
    void (*finalizer)(void *))
{
    uo_refcount *refcount = &uo_refcount_linkpool_rent()->item;
    atomic_init(&refcount->count, 1);
    refcount->ptr = ptr;
    refcount->finalizer = finalizer;
    return refcount;
}